

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_RollbackAfterFillingRegion_Test::Transaction_RollbackAfterFillingRegion_Test
          (Transaction_RollbackAfterFillingRegion_Test *this)

{
  anon_unknown.dwarf_32ce0a::Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction).super_Test._vptr_Test = (_func_int **)&PTR__Transaction_0025b198;
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterFillingRegion) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto align = 1U;

    mock_mutex mutex;
    using guard_type = std::unique_lock<mock_mutex>;

    {
        auto t1 = begin (db_, guard_type{mutex});
        t1.allocate (regions.back ()->end () - db_.size () - sizeof (pstore::trailer), align);
        t1.commit ();
    }
    EXPECT_EQ (regions.size (), original_num_regions)
        << "Expected the first allocate to fill the initial region";

    std::uint64_t const original_size = file->size ();
    {
        auto t2 = begin (db_, guard_type{mutex});
        t2.allocate (sizeof (int), align);
        t2.rollback ();
    }
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}